

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfwinfo.c
# Opt level: O3

void list_extensions(int api,int major,int minor)

{
  byte bVar1;
  GLFWglproc p_Var2;
  byte *pbVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  GLint count;
  int local_1c;
  
  pcVar4 = "Unknown API";
  if (api == 0x30002) {
    pcVar4 = "OpenGL ES";
  }
  pcVar6 = "OpenGL";
  if (api != 0x30001) {
    pcVar6 = pcVar4;
  }
  printf("%s context supported extensions:\n",pcVar6);
  if (major < 3 || api != 0x30001) {
    pbVar3 = (byte *)glGetString(0x1f03);
    while( true ) {
      bVar1 = *pbVar3;
      uVar5 = 10;
      if ((bVar1 != 0x20) && (uVar5 = (uint)bVar1, bVar1 == 0)) break;
      putchar(uVar5);
      pbVar3 = pbVar3 + 1;
    }
  }
  else {
    p_Var2 = glfwGetProcAddress("glGetStringi");
    if (p_Var2 == (GLFWglproc)0x0) {
      glfwTerminate();
      exit(1);
    }
    glGetIntegerv(0x821d,&local_1c);
    if (0 < local_1c) {
      uVar5 = 0;
      do {
        pcVar4 = (char *)(*p_Var2)(0x1f03,(ulong)uVar5);
        puts(pcVar4);
        uVar5 = uVar5 + 1;
      } while ((int)uVar5 < local_1c);
    }
  }
  putchar(10);
  return;
}

Assistant:

static void list_extensions(int api, int major, int minor)
{
    int i;
    GLint count;
    const GLubyte* extensions;

    printf("%s context supported extensions:\n", get_api_name(api));

    if (api == GLFW_OPENGL_API && major > 2)
    {
        PFNGLGETSTRINGIPROC glGetStringi =
            (PFNGLGETSTRINGIPROC) glfwGetProcAddress("glGetStringi");
        if (!glGetStringi)
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glGetIntegerv(GL_NUM_EXTENSIONS, &count);

        for (i = 0;  i < count;  i++)
            puts((const char*) glGetStringi(GL_EXTENSIONS, i));
    }
    else
    {
        extensions = glGetString(GL_EXTENSIONS);
        while (*extensions != '\0')
        {
            if (*extensions == ' ')
                putchar('\n');
            else
                putchar(*extensions);

            extensions++;
        }
    }

    putchar('\n');
}